

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

bool __thiscall
crnlib::dynamic_string::expand_buf(dynamic_string *this,uint new_buf_size,bool preserve_contents)

{
  uint uVar1;
  uint32 b;
  char *__dest;
  char *__src;
  char *p;
  bool preserve_contents_local;
  uint new_buf_size_local;
  dynamic_string *this_local;
  
  uVar1 = math::maximum<unsigned_int>((uint)this->m_buf_size,new_buf_size);
  b = math::next_pow2(uVar1);
  uVar1 = math::minimum<unsigned_int>(0xffff,b);
  if (uVar1 != this->m_buf_size) {
    __dest = crnlib_new_array<char>(uVar1);
    if (preserve_contents) {
      __src = get_ptr_priv(this);
      memcpy(__dest,__src,(long)(int)(this->m_len + 1));
    }
    crnlib_delete_array<char>(this->m_pStr);
    this->m_pStr = __dest;
    this->m_buf_size = (uint16)uVar1;
    if (preserve_contents) {
      check(this);
    }
  }
  return uVar1 <= this->m_buf_size;
}

Assistant:

bool dynamic_string::expand_buf(uint new_buf_size, bool preserve_contents)
    {
        new_buf_size = math::minimum<uint>(cUINT16_MAX, math::next_pow2(math::maximum<uint>(m_buf_size, new_buf_size)));

        if (new_buf_size != m_buf_size)
        {
            char* p = crnlib_new_array<char>(new_buf_size);

            if (preserve_contents)
            {
                memcpy(p, get_ptr_priv(), m_len + 1);
            }

            crnlib_delete_array(m_pStr);
            m_pStr = p;

            m_buf_size = static_cast<uint16>(new_buf_size);

            if (preserve_contents)
            {
                check();
            }
        }

        return m_buf_size >= new_buf_size;
    }